

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

JavascriptBigInt *
Js::JavascriptBigInt::Create
          (char16 *content,charcount_t cchUseLength,bool isNegative,ScriptContext *scriptContext)

{
  byte bVar1;
  charcount_t cchUseLength_00;
  char16 *content_00;
  Recycler *pRVar2;
  JavascriptBigInt *this;
  JavascriptLibrary *this_00;
  StaticType *type;
  TrackAllocData local_48;
  ScriptContext *local_20;
  ScriptContext *scriptContext_local;
  bool isNegative_local;
  char16 *pcStack_10;
  charcount_t cchUseLength_local;
  char16 *content_local;
  
  local_20 = scriptContext;
  scriptContext_local._3_1_ = isNegative;
  scriptContext_local._4_4_ = cchUseLength;
  pcStack_10 = content;
  pRVar2 = ScriptContext::GetRecycler(scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
             ,0xb);
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_48);
  this = (JavascriptBigInt *)new<Memory::Recycler>(0x30,pRVar2,0x43c4b0);
  content_00 = pcStack_10;
  cchUseLength_00 = scriptContext_local._4_4_;
  bVar1 = scriptContext_local._3_1_;
  this_00 = ScriptContext::GetLibrary(local_20);
  type = JavascriptLibrary::GetBigIntTypeStatic(this_00);
  JavascriptBigInt(this,content_00,cchUseLength_00,(bool)(bVar1 & 1),type);
  return this;
}

Assistant:

JavascriptBigInt * JavascriptBigInt::Create(const char16 * content, charcount_t cchUseLength, bool isNegative, ScriptContext * scriptContext)
    {
        return RecyclerNew(scriptContext->GetRecycler(), JavascriptBigInt, content, cchUseLength, isNegative, scriptContext->GetLibrary()->GetBigIntTypeStatic());
    }